

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O3

int MT_basic_insert_test(void)

{
  undefined8 *puVar1;
  ThreadArgs *pTVar2;
  LatencyCollector *pLVar3;
  ThreadArgs *u_args;
  long lVar4;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> t_hdl;
  LatencyDumpDefaultImpl default_dump;
  LatencyCollector lat;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> local_118;
  ThreadArgs *local_100;
  string local_f8;
  LatencyDump local_d8;
  code *local_d0 [2];
  code *local_c0;
  code *local_b8;
  LatencyCollectorDumpOptions local_b0;
  _Any_data local_a8;
  code *local_98;
  undefined8 uStack_90;
  LatencyCollector local_88;
  
  pLVar3 = (LatencyCollector *)operator_new(0x58);
  LatencyCollector::LatencyCollector(pLVar3);
  global_lat = pLVar3;
  LatencyCollector::LatencyCollector(&local_88);
  local_118.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x2c0);
  local_118.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_118.
       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>._M_impl
       .super__Vector_impl_data._M_start + 8;
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)&((local_118.
                       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                       ._M_impl.super__Vector_impl_data._M_start)->args).func.super__Function_base.
                     _M_manager + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((local_118.
                       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                       ._M_impl.super__Vector_impl_data._M_start)->args).func.super__Function_base.
                     _M_functor + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((local_118.
                       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                       ._M_impl.super__Vector_impl_data._M_start)->handler)._M_invoker + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((local_118.
                       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                       ._M_impl.super__Vector_impl_data._M_start)->handler).super__Function_base.
                     _M_functor + lVar4 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&(local_118.
                      super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                      ._M_impl.super__Vector_impl_data._M_start)->tid + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)
     ((long)&((local_118.
               super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
               ._M_impl.super__Vector_impl_data._M_start)->args).rc + lVar4) = 0;
    lVar4 = lVar4 + 0x58;
  } while (lVar4 != 0x2c0);
  local_118.super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_118.
       super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>._M_impl
       .super__Vector_impl_data._M_start + 8;
  u_args = (ThreadArgs *)operator_new(0x40);
  *(undefined8 *)(u_args + 0x30) = 0;
  *(undefined8 *)(u_args + 0x38) = 0;
  *(undefined8 *)(u_args + 0x20) = 0;
  *(undefined8 *)(u_args + 0x28) = 0;
  *(undefined8 *)(u_args + 0x10) = 0;
  *(undefined8 *)(u_args + 0x18) = 0;
  *(undefined8 *)u_args = 0;
  *(undefined8 *)(u_args + 8) = 0;
  lVar4 = 0;
  local_100 = u_args;
  do {
    *(LatencyCollector **)u_args = &local_88;
    local_d0[1] = (code *)0x0;
    local_d0[0] = insert_thread;
    local_b8 = std::
               _Function_handler<int_(TestSuite::ThreadArgs_*),_int_(*)(TestSuite::ThreadArgs_*)>::
               _M_invoke;
    local_c0 = std::
               _Function_handler<int_(TestSuite::ThreadArgs_*),_int_(*)(TestSuite::ThreadArgs_*)>::
               _M_manager;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_98 = (code *)0x0;
    uStack_90 = 0;
    TestSuite::ThreadHolder::spawn
              ((ThreadHolder *)
               ((long)&(local_118.
                        super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                        ._M_impl.super__Vector_impl_data._M_start)->tid + lVar4),u_args,
               (ThreadFunc *)local_d0,(ThreadExitHandler *)&local_a8);
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if (local_c0 != (code *)0x0) {
      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
    }
    pTVar2 = local_100;
    lVar4 = lVar4 + 0x58;
    u_args = u_args + 8;
  } while (lVar4 != 0x2c0);
  lVar4 = 0;
  do {
    TestSuite::ThreadHolder::join
              ((ThreadHolder *)
               ((long)&(local_118.
                        super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                        ._M_impl.super__Vector_impl_data._M_start)->tid + lVar4),false);
    lVar4 = lVar4 + 0x58;
  } while (lVar4 != 0x2c0);
  local_d8._vptr_LatencyDump = (_func_int **)&PTR_dump_abi_cxx11__0010ecd8;
  local_b0.sort_by = NAME;
  local_b0.view_type = TREE;
  LatencyCollector::dump_abi_cxx11_(&local_f8,&local_88,&local_d8,&local_b0);
  if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
      (((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
       (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  }
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_b0.sort_by = NAME;
  local_b0.view_type = TREE;
  LatencyCollector::dump_abi_cxx11_(&local_f8,global_lat,&local_d8,&local_b0);
  if ((((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
       ((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')))) &&
      (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  }
  if (((TestSuite::getCurTest()::cur_test != (char *)0x0) &&
      (((*TestSuite::getCurTest()::cur_test != '\0' ||
        (TestSuite::getCurTest()::cur_test[0x3c] == '\x01')) &&
       (TestSuite::getCurTest()::cur_test[0x3b] != '\x01')))) ||
     (TestSuite::globalMsgFlag()::global_msg_flag == '\x01')) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  pLVar3 = global_lat;
  if (global_lat != (LatencyCollector *)0x0) {
    LatencyCollector::~LatencyCollector(global_lat);
  }
  operator_delete(pLVar3);
  global_lat = (LatencyCollector *)0x0;
  operator_delete(pTVar2);
  std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::~vector
            (&local_118);
  LatencyCollector::~LatencyCollector(&local_88);
  return 0;
}

Assistant:

int MT_basic_insert_test() {
    global_lat = new LatencyCollector();

    size_t i;
    size_t n_threads = 8;

    LatencyCollector lat;

    std::vector<TestSuite::ThreadHolder> t_hdl(n_threads);
    std::vector<test_args> args(n_threads);
    for (i=0; i<n_threads; ++i) {
        args[i].lat = &lat;
        t_hdl[i].spawn(&args[i], insert_thread, nullptr);
    }

    for (i=0; i<n_threads; ++i){
        t_hdl[i].join();
    }

    LatencyDumpDefaultImpl default_dump;
    TestSuite::Msg msg_stream;
    msg_stream << lat.dump(&default_dump) << std::endl;
    msg_stream << global_lat->dump(&default_dump) << std::endl;

    delete global_lat;
    global_lat = nullptr;

    return 0;
}